

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O2

bool __thiscall r_exec::GMonitor::reduce(GMonitor *this,_Fact *input)

{
  HLPBindingMap *bm;
  PrimaryMDLController *this_00;
  Fact *super_goal;
  bool bVar1;
  short sVar2;
  int iVar3;
  MatchResult MVar4;
  Pred *pPVar5;
  _Fact *p_Var6;
  Sim *sim;
  long *plVar7;
  _Fact *this_01;
  Goal *pGVar8;
  _func_int **pp_Var9;
  undefined8 uVar10;
  _Object *p_Var11;
  MDLController *pMVar12;
  float fVar13;
  float fVar14;
  undefined4 extraout_var;
  
  iVar3 = (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xe])();
  if ((char)iVar3 != '\0') {
    return true;
  }
  if (((this->injected_goal == false) && (this->predicted_evidence != (_Fact *)0x0)) &&
     (iVar3 = (*(this->predicted_evidence->super_LObject).
                super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                super__Object._vptr__Object[0xe])(), (char)iVar3 != '\0')) {
    PMDLController::register_predicted_goal_outcome
              ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
               (Fact *)(this->super__GMonitor).super_Monitor.target.object,
               (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object,
               (Fact *)(this->super__GMonitor).f_imdl.object,false,this->injected_goal);
    this->predicted_evidence = (_Fact *)0x0;
    this->injected_goal = true;
    return false;
  }
  pPVar5 = _Fact::get_pred(input);
  if (pPVar5 != (Pred *)0x0) {
    p_Var6 = Pred::get_target(pPVar5);
    if ((this->super__GMonitor).simulating == 0) {
      MVar4 = _Fact::is_evidence(p_Var6,(this->super__GMonitor).goal_target);
      if (MVar4 == MATCH_FAILURE) {
        return false;
      }
      if (MVar4 == MATCH_SUCCESS_NEGATIVE) {
        PMDLController::register_predicted_goal_outcome
                  ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
                   (Fact *)(this->super__GMonitor).super_Monitor.target.object,
                   (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object,
                   (Fact *)(this->super__GMonitor).f_imdl.object,false,this->injected_goal);
        this->predicted_evidence = (_Fact *)0x0;
        this->injected_goal = true;
        iVar3 = (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xe])();
        return SUB41(iVar3,0);
      }
      if (MVar4 == MATCH_SUCCESS_POSITIVE) {
        if (this->injected_goal == true) {
          PMDLController::register_predicted_goal_outcome
                    ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
                     (Fact *)(this->super__GMonitor).super_Monitor.target.object,
                     (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object,
                     (Fact *)(this->super__GMonitor).f_imdl.object,true,true);
        }
        if (this->predicted_evidence == (_Fact *)0x0) {
          return false;
        }
        fVar13 = _Fact::get_cfd(p_Var6);
        pPVar5 = _Fact::get_pred(this->predicted_evidence);
        p_Var6 = Pred::get_target(pPVar5);
        fVar14 = _Fact::get_cfd(p_Var6);
        if (fVar13 <= fVar14) {
          return false;
        }
        this->predicted_evidence = input;
        return false;
      }
    }
    else {
      sim = Pred::get_simulation
                      (pPVar5,(Controller *)(this->super__GMonitor).super_Monitor.target.object);
      if (sim == (Sim *)0x0) {
        return false;
      }
      iVar3 = (*(p_Var6->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(p_Var6,0);
      plVar7 = (long *)CONCAT44(extraout_var,iVar3);
      (**(code **)(*plVar7 + 0x20))(plVar7,0);
      sVar2 = r_code::Atom::asOpcode();
      if (sVar2 == Opcodes::Success) {
        this_01 = (_Fact *)(**(code **)(*plVar7 + 0x48))(plVar7,1);
        pGVar8 = _Fact::get_goal(this_01);
        if (pGVar8 != (Goal *)0x0) {
          bVar1 = _Fact::is_fact(p_Var6);
          _GMonitor::store_simulated_outcome(&this->super__GMonitor,pGVar8,sim,bVar1);
          return false;
        }
      }
      else {
        MVar4 = _Fact::is_evidence(p_Var6,(this->super__GMonitor).goal_target);
        if (MVar4 == MATCH_FAILURE) {
          return false;
        }
        if (MVar4 == MATCH_SUCCESS_NEGATIVE) {
          pMVar12 = (this->super__GMonitor).super_Monitor.controller;
          (*(pMVar12->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[0x10])
                    (pMVar12,(this->super__GMonitor).super_Monitor.target.object,0,input);
          return false;
        }
        if (MVar4 == MATCH_SUCCESS_POSITIVE) {
          pMVar12 = (this->super__GMonitor).super_Monitor.controller;
          (*(pMVar12->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[0x10])
                    (pMVar12,(this->super__GMonitor).super_Monitor.target.object,1,input);
          return false;
        }
      }
    }
LAB_0017ddf8:
    std::operator<<((ostream *)&std::cerr,"reached invalid state!");
    return false;
  }
  pGVar8 = _Fact::get_goal((_Fact *)(this->super__GMonitor).super_Monitor.target.object);
  bVar1 = Goal::ground_invalidated(pGVar8,input);
  if (bVar1) {
    (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xf])();
    bm = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
    this_00 = (PrimaryMDLController *)(this->super__GMonitor).super_Monitor.controller;
    p_Var11 = (pGVar8->sim).object;
    super_goal = (Fact *)p_Var11[2].refCount.super___atomic_base<long>._M_i;
    bVar1 = *(bool *)((long)&p_Var11[1].refCount.super___atomic_base<long>._M_i + 1);
    fVar13 = _Fact::get_cfd((this->super__GMonitor).goal_target);
    PrimaryMDLController::abduce(this_00,bm,super_goal,bVar1,(double)fVar13);
    return true;
  }
  MVar4 = _Fact::is_evidence(input,(this->super__GMonitor).goal_target);
  if (MVar4 == MATCH_FAILURE) {
    return false;
  }
  if (MVar4 == MATCH_SUCCESS_NEGATIVE) {
    p_Var11 = (this->super__GMonitor).super_Monitor.target.object;
    pMVar12 = (this->super__GMonitor).super_Monitor.controller;
    pp_Var9 = (pMVar12->super_HLPController).super_OController.super_Controller.super__Object.
              _vptr__Object;
    uVar10 = 0;
  }
  else {
    if (MVar4 != MATCH_SUCCESS_POSITIVE) goto LAB_0017ddf8;
    p_Var11 = (this->super__GMonitor).super_Monitor.target.object;
    pMVar12 = (this->super__GMonitor).super_Monitor.controller;
    pp_Var9 = (pMVar12->super_HLPController).super_OController.super_Controller.super__Object.
              _vptr__Object;
    uVar10 = 1;
  }
  (*pp_Var9[0xf])(pMVar12,p_Var11,uVar10,input);
  return true;
}

Assistant:

bool GMonitor::reduce(_Fact *input)   // executed by a reduction core; invalidation check performed in Monitor::is_alive().
{
    if (target->is_invalidated()) {
        return true;
    }

    if (!injected_goal) {
        if (predicted_evidence && predicted_evidence->is_invalidated()) { // the predicted evidence was wrong.
            ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, false, injected_goal); // report a predicted failure; this will inject the goal.
            predicted_evidence = nullptr;
            injected_goal = true;
            return false;
        }
    }

    Pred *prediction = input->get_pred();

    if (prediction) { // input is f0->pred->f1->object.
        _Fact *_input = prediction->get_target(); // _input is f1->obj.

        if (simulating) { // injected_goal==true.
            Sim *sim = prediction->get_simulation(target);

            if (sim) {
                Code *outcome = _input->get_reference(0);

                if (outcome->code(0).asOpcode() == Opcodes::Success) { // _input is f1->success or |f1->success.
                    _Fact *f_success = (_Fact *)outcome->get_reference(SUCCESS_OBJ);
                    Goal *affected_goal = f_success->get_goal();

                    if (affected_goal) {
                        store_simulated_outcome(affected_goal, sim, _input->is_fact());
                        return false;
                    }
                } else { // report the simulated outcome: this will inject a simulated prediction of the outcome, to allow any g-monitor deciding on this ground.
                    switch (_input->is_evidence(goal_target)) {
                    case MATCH_SUCCESS_POSITIVE:
                        ((PMDLController *)controller)->register_simulated_goal_outcome(target, true, input); // report a simulated success.
                        return false;

                    case MATCH_SUCCESS_NEGATIVE:
                        ((PMDLController *)controller)->register_simulated_goal_outcome(target, false, input); // report a simulated failure.
                        return false;

                    case MATCH_FAILURE:
                        return false;
                    }
                }
            } else { // during simulation (SIM_ROOT) if the prediction is actual, positive and comes true, we'll eventually catch an actual evidence; otherwise (positive that does not come true or negative), keep simulating: in any case ignore it.
                return false;
            }
        } else {
            switch (_input->is_evidence(goal_target)) {
            case MATCH_SUCCESS_POSITIVE:
                if (injected_goal) {
                    ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, true, true);    // report a predicted success.
                }

                if (predicted_evidence && _input->get_cfd() > predicted_evidence->get_pred()->get_target()->get_cfd()) { // bias toward cfd instead of age.
                    predicted_evidence = input;
                }

                return false;

            case MATCH_SUCCESS_NEGATIVE:
                ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, false, injected_goal); // report a predicted failure; this may invalidate the target.
                predicted_evidence = nullptr;
                injected_goal = true;
                return target->is_invalidated();

            case MATCH_FAILURE:
                return false;
            }
        }
    } else { // input is an actual fact.
        Goal *g = target->get_goal();

        if (g->ground_invalidated(input)) { // invalidate the goal and abduce from the super-goal.
            target->invalidate();
            ((PrimaryMDLController *)controller)->abduce(bindings, g->sim->super_goal, g->sim->opposite, goal_target->get_cfd());
            return true;
        }

        switch (input->is_evidence(goal_target)) {
        case MATCH_SUCCESS_POSITIVE:
            ((PMDLController *)controller)->register_goal_outcome(target, true, input); // report a success.
            return true;

        case MATCH_SUCCESS_NEGATIVE:
            ((PMDLController *)controller)->register_goal_outcome(target, false, input); // report a failure.
            return true;

        case MATCH_FAILURE:
            return false;
        }
    }

    std::cerr << "reached invalid state!";
    return false;
}